

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pcre2test.c
# Opt level: O0

void show_memory_info(void)

{
  int local_20;
  size_t cblock_size;
  size_t size;
  uint32_t name_entry_size;
  uint32_t name_count;
  
  if (test_mode == 8) {
    local_20 = 0x80;
  }
  pattern_info(0x16,&cblock_size,0);
  pattern_info(0x11,(void *)((long)&size + 4),0);
  pattern_info(0x12,&size,0);
  fprintf((FILE *)outfile,"Memory allocation (code space): %d\n",
          (ulong)(uint)(((int)cblock_size - size._4_4_ * (int)size * code_unit_size) - local_20));
  if (pat_patctl.jit != 0) {
    pattern_info(10,&cblock_size,0);
    fprintf((FILE *)outfile,"Memory allocation (JIT code): %d\n",cblock_size & 0xffffffff);
  }
  return;
}

Assistant:

static void
show_memory_info(void)
{
uint32_t name_count, name_entry_size;
size_t size, cblock_size;

#ifdef SUPPORT_PCRE2_8
if (test_mode == 8) cblock_size = sizeof(pcre2_real_code_8);
#endif
#ifdef SUPPORT_PCRE2_16
if (test_mode == 16) cblock_size = sizeof(pcre2_real_code_16);
#endif
#ifdef SUPPORT_PCRE2_32
if (test_mode == 32) cblock_size = sizeof(pcre2_real_code_32);
#endif

(void)pattern_info(PCRE2_INFO_SIZE, &size, FALSE);
(void)pattern_info(PCRE2_INFO_NAMECOUNT, &name_count, FALSE);
(void)pattern_info(PCRE2_INFO_NAMEENTRYSIZE, &name_entry_size, FALSE);
fprintf(outfile, "Memory allocation (code space): %d\n",
  (int)(size - name_count*name_entry_size*code_unit_size - cblock_size));
if (pat_patctl.jit != 0)
  {
  (void)pattern_info(PCRE2_INFO_JITSIZE, &size, FALSE);
  fprintf(outfile, "Memory allocation (JIT code): %d\n", (int)size);
  }
}